

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

QRegion __thiscall QTreeView::visualRegionForSelection(QTreeView *this,QItemSelection *selection)

{
  QTreeViewPrivate *this_00;
  QWidgetData *pQVar1;
  QAbstractItemModel *pQVar2;
  undefined1 *puVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  Representation RVar10;
  int iVar11;
  Representation RVar12;
  Representation RVar13;
  uint uVar14;
  uint uVar15;
  long in_RDX;
  QItemSelectionRange *pQVar16;
  undefined8 in_R9;
  QItemSelectionRange *range;
  QItemSelectionRange *this_01;
  long in_FS_OFFSET;
  QRect QVar17;
  QPersistentModelIndex *this_02;
  undefined1 local_e8 [12];
  Representation RStack_dc;
  undefined1 local_d8 [16];
  QAbstractItemModel *local_c8;
  undefined1 local_b8 [16];
  QModelIndex local_a8;
  QModelIndex local_88;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDX + 0x10) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QRegion::QRegion((QRegion *)this);
      return (QRegion)(QRegionData *)this;
    }
  }
  else {
    this_00 = (QTreeViewPrivate *)(selection->super_QList<QItemSelectionRange>).d.ptr;
    *(undefined1 **)
     &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget =
         &DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion((QRegion *)this);
    pQVar1 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    local_48.x2.m_i = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
    local_48.y2.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
    local_48.x1.m_i = 0;
    local_48.y1.m_i = 0;
    if (*(long *)(in_RDX + 0x10) != 0) {
      this_01 = *(QItemSelectionRange **)(in_RDX + 8);
      pQVar16 = this_01 + *(long *)(in_RDX + 0x10);
      do {
        bVar6 = QItemSelectionRange::isValid(this_01);
        if (bVar6) {
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
          QPersistentModelIndex::parent();
          local_88.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_88.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_88,&this_01->tl);
          pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
          iVar8 = (**(code **)(*(long *)pQVar2 + 0x80))(pQVar2,&local_68);
          uVar9 = local_88.r | local_88.c;
          uVar14 = local_88.c;
          uVar15 = local_88.r;
          puVar3 = (undefined1 *)local_88._0_8_;
          if (local_88.m.ptr != (QAbstractItemModel *)0x0 && -1 < (int)uVar9) {
            while( true ) {
              cVar7 = (**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x2c].
                                   super_QArrayData)(selection,&local_88);
              uVar14 = local_88.c;
              uVar15 = local_88.r;
              puVar3 = (undefined1 *)local_88._0_8_;
              if (cVar7 == '\0') break;
              if (iVar8 <= (int)(local_88.c + 1U)) {
                local_88.i = 0;
                local_88.m.ptr = (QAbstractItemModel *)0x0;
                local_88.r = 0xffffffff;
                goto LAB_005a655d;
              }
              pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
              (**(code **)(*(long *)pQVar2 + 0x60))
                        (&local_a8,pQVar2,local_88._0_8_ & 0xffffffff,local_88.c + 1U,&local_68);
              local_88.m.ptr = local_a8.m.ptr;
              uVar14 = local_a8.c;
              uVar15 = local_a8.r;
              local_88.r = local_a8.r;
              local_88.c = local_a8.c;
              local_88.i = local_a8.i;
              puVar3 = (undefined1 *)local_a8._0_8_;
              if ((((int)uVar15 < 0) ||
                  (puVar3 = (undefined1 *)local_88._0_8_, (long)local_a8._0_8_ < 0)) ||
                 (local_88._0_8_ = (undefined1 *)local_a8._0_8_,
                 local_a8.m.ptr == (QAbstractItemModel *)0x0)) break;
            }
          }
          local_88._0_8_ = puVar3;
          if (((-1 < (int)uVar15) && (-1 < (int)uVar14)) &&
             (local_88.m.ptr != (QAbstractItemModel *)0x0)) {
            local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QVar17 = QTreeViewPrivate::visualRect(this_00,&local_88,SingleSection);
            this_02 = &this_01->br;
            local_a8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_a8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
            local_b8 = (undefined1  [16])QVar17;
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_a8,this_02);
            uVar9 = local_a8.r | local_a8.c;
            uVar15 = local_a8.c;
            uVar14 = local_a8.r;
            uVar5 = local_a8._0_8_;
            if (local_a8.m.ptr != (QAbstractItemModel *)0x0 && -1 < (int)uVar9) {
              while( true ) {
                cVar7 = (**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x2c].
                                     super_QArrayData)(selection,&local_a8);
                uVar15 = local_a8.c;
                uVar14 = local_a8.r;
                uVar5 = local_a8._0_8_;
                if (cVar7 == '\0') break;
                if (local_a8.c < 1) goto LAB_005a655d;
                pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
                (**(code **)(*(long *)pQVar2 + 0x60))
                          (local_d8,pQVar2,local_a8._0_8_ & 0xffffffff,local_a8.c - 1,&local_68,
                           in_R9,this,this_02);
                auVar4 = local_d8;
                local_a8.m.ptr = local_c8;
                puVar3 = (undefined1 *)local_d8._0_8_;
                local_a8.i = local_d8._8_8_;
                local_a8.r = local_d8._0_4_;
                local_a8.c = local_d8._4_4_;
                uVar5 = local_a8._0_8_;
                local_a8.r = auVar4._0_4_;
                local_a8.c = auVar4._4_4_;
                uVar15 = local_a8.c;
                uVar14 = local_a8.r;
                local_d8 = auVar4;
                if (((local_a8.r < 0) || (local_a8.c < 0)) ||
                   (local_a8._0_8_ = puVar3, local_c8 == (QAbstractItemModel *)0x0)) break;
              }
            }
            local_a8._0_8_ = uVar5;
            if (((-1 < (int)uVar14) && (-1 < (int)uVar15)) &&
               (local_a8.m.ptr != (QAbstractItemModel *)0x0)) {
              local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_d8 = (undefined1  [16])
                         QTreeViewPrivate::visualRect(this_00,&local_a8,SingleSection);
              RVar12 = QVar17.y1.m_i;
              RVar13.m_i = local_d8._12_4_;
              RVar10.m_i = RVar13.m_i;
              if (RVar12.m_i < RVar13.m_i) {
                RVar10.m_i = RVar12.m_i;
              }
              if (RVar13.m_i < RVar12.m_i) {
                RVar13.m_i = RVar12.m_i;
              }
              bVar6 = QHeaderView::sectionsMoved(this_00->header);
              if (bVar6) {
                iVar8 = QPersistentModelIndex::column();
                iVar11 = QPersistentModelIndex::column();
                if (iVar8 <= iVar11) {
                  do {
                    local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    stack0xffffffffffffff20 = &DAT_aaaaaaaaaaaaaaaa;
                    RVar12.m_i = QHeaderView::sectionViewportPosition
                                           ((QHeaderView *)
                                            (selection->super_QList<QItemSelectionRange>).d.ptr
                                            [0x59].tl.d,iVar8);
                    iVar11 = QHeaderView::sectionSize
                                       ((QHeaderView *)
                                        (selection->super_QList<QItemSelectionRange>).d.ptr[0x59].tl
                                        .d,iVar8);
                    local_e8._4_4_ = RVar10.m_i;
                    local_e8._0_4_ = RVar12.m_i;
                    RStack_dc.m_i = RVar13.m_i;
                    local_e8._8_4_ = RVar12.m_i + -1 + iVar11;
                    cVar7 = QRect::intersects(&local_48);
                    if (cVar7 != '\0') {
                      QRegion::operator+=((QRegion *)this,(QRect *)local_e8);
                    }
                    iVar11 = QPersistentModelIndex::column();
                    bVar6 = iVar8 < iVar11;
                    iVar8 = iVar8 + 1;
                  } while (bVar6);
                }
              }
              else {
                local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                stack0xffffffffffffff20 = &DAT_aaaaaaaaaaaaaaaa;
                _local_e8 = (QRect)QRect::operator|((QRect *)local_b8,(QRect *)local_d8);
                QWidget::layoutDirection((QWidget *)selection);
                iVar8 = QPersistentModelIndex::column();
                RVar13.m_i = QHeaderView::sectionViewportPosition
                                       ((QHeaderView *)
                                        (selection->super_QList<QItemSelectionRange>).d.ptr[0x59].tl
                                        .d,iVar8);
                local_e8._0_4_ = RVar13.m_i;
                cVar7 = QRect::intersects(&local_48);
                if (cVar7 != '\0') {
                  QRegion::operator+=((QRegion *)this,(QRect *)local_e8);
                }
              }
            }
          }
        }
LAB_005a655d:
        this_01 = this_01 + 1;
      } while (this_01 != pQVar16);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (QRegion)(QRegionData *)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QRegion QTreeView::visualRegionForSelection(const QItemSelection &selection) const
{
    Q_D(const QTreeView);
    if (selection.isEmpty())
        return QRegion();

    QRegion selectionRegion;
    const QRect &viewportRect = d->viewport->rect();
    for (const auto &range : selection) {
        if (!range.isValid())
            continue;
        QModelIndex parent = range.parent();
        QModelIndex leftIndex = range.topLeft();
        int columnCount = d->model->columnCount(parent);
        while (leftIndex.isValid() && isIndexHidden(leftIndex)) {
            if (leftIndex.column() + 1 < columnCount)
                leftIndex = d->model->index(leftIndex.row(), leftIndex.column() + 1, parent);
            else
                leftIndex = QModelIndex();
        }
        if (!leftIndex.isValid())
            continue;
        const QRect leftRect = d->visualRect(leftIndex, QTreeViewPrivate::SingleSection);
        int top = leftRect.top();
        QModelIndex rightIndex = range.bottomRight();
        while (rightIndex.isValid() && isIndexHidden(rightIndex)) {
            if (rightIndex.column() - 1 >= 0)
                rightIndex = d->model->index(rightIndex.row(), rightIndex.column() - 1, parent);
            else
                rightIndex = QModelIndex();
        }
        if (!rightIndex.isValid())
            continue;
        const QRect rightRect = d->visualRect(rightIndex, QTreeViewPrivate::SingleSection);
        int bottom = rightRect.bottom();
        if (top > bottom)
            qSwap<int>(top, bottom);
        int height = bottom - top + 1;
        if (d->header->sectionsMoved()) {
            for (int c = range.left(); c <= range.right(); ++c) {
                const QRect rangeRect(columnViewportPosition(c), top, columnWidth(c), height);
                if (viewportRect.intersects(rangeRect))
                    selectionRegion += rangeRect;
            }
        } else {
            QRect combined = leftRect|rightRect;
            combined.setX(columnViewportPosition(isRightToLeft() ? range.right() : range.left()));
            if (viewportRect.intersects(combined))
                selectionRegion += combined;
        }
    }
    return selectionRegion;
}